

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv6transmitter.cpp
# Opt level: O2

int __thiscall jrtplib::RTPUDPv6Transmitter::AbortWait(RTPUDPv6Transmitter *this)

{
  int iVar1;
  
  if (this->init == true) {
    if (this->created == true) {
      if (this->waitingfordata == true) {
        RTPAbortDescriptors::SendAbortSignal(this->m_pAbortDesc);
        return 0;
      }
      iVar1 = -0x73;
    }
    else {
      iVar1 = -0x71;
    }
  }
  else {
    iVar1 = -0x72;
  }
  return iVar1;
}

Assistant:

int RTPUDPv6Transmitter::AbortWait()
{
	if (!init)
		return ERR_RTP_UDPV6TRANS_NOTINIT;
	
	MAINMUTEX_LOCK
	if (!created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV6TRANS_NOTCREATED;
	}
	if (!waitingfordata)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV6TRANS_NOTWAITING;
	}

	m_pAbortDesc->SendAbortSignal();
	
	MAINMUTEX_UNLOCK
	return 0;
}